

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

int lws_parse_urldecode(lws *wsi,uint8_t *_c)

{
  uint16_t *puVar1;
  byte bVar2;
  allocated_headers *paVar3;
  allocated_headers *paVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  ushort uVar9;
  ah_data_idx_t aVar10;
  uint uVar11;
  ulong uVar12;
  
  paVar3 = (wsi->http).ah;
  bVar7 = *_c;
  cVar6 = paVar3->ues;
  if (cVar6 != '\x02') {
    if (cVar6 == '\x01') {
      cVar6 = char_to_hex(bVar7);
      if (cVar6 < '\0') {
        return 2;
      }
      paVar3->esc_stash = bVar7;
      paVar3->ues = '\x02';
    }
    else {
      if ((cVar6 != '\0') || (bVar7 != 0x25)) {
        bVar5 = false;
        goto LAB_0011cf62;
      }
      paVar3->ues = '\x01';
    }
    goto LAB_0011cf14;
  }
  cVar6 = char_to_hex(bVar7);
  if (cVar6 < '\0') {
    return 2;
  }
  cVar6 = char_to_hex(paVar3->esc_stash);
  bVar7 = char_to_hex(bVar7);
  bVar7 = bVar7 | cVar6 << 4;
  *_c = bVar7;
  paVar3->ues = '\0';
  bVar5 = true;
LAB_0011cf62:
  if ((bVar7 == 0) && ((paVar3->frag_index[0x4c] == '\0' || (paVar3->post_literal_equal == '\0'))))
  {
    _lws_log(2,"%s: saw NUL outside of uri args\n","lws_parse_urldecode");
    goto LAB_0011d051;
  }
  switch(paVar3->ups) {
  case '\0':
    if ((bVar7 == 0x3b || bVar7 == 0x26) && !bVar5) {
      iVar8 = issue_char(wsi,'\0');
      if (-1 < iVar8) {
        paVar4 = (wsi->http).ah;
        puVar1 = &paVar4->frags[paVar4->nfrag].len;
        *puVar1 = *puVar1 - 1;
        bVar7 = paVar3->nfrag + 1;
        paVar3->frags[paVar3->nfrag].nfrag = bVar7;
        paVar3->nfrag = bVar7;
        if (0x5f < bVar7) {
          return 3;
        }
        paVar3->post_literal_equal = '\0';
        aVar10 = paVar3->pos + 1;
        paVar3->pos = aVar10;
        paVar3->frags[bVar7].offset = aVar10;
        paVar3->frags[bVar7].len = 0;
        paVar3->frags[bVar7].nfrag = '\0';
        goto LAB_0011cf14;
      }
      goto LAB_0011d051;
    }
    if (((bVar5 && bVar7 == 0x3d) && (paVar3->frag_index[0x4c] != '\0')) &&
       (paVar3->post_literal_equal == '\0')) {
      *_c = '_';
      bVar7 = 0x5f;
    }
    if (bVar7 == 0x3d && !bVar5) {
      paVar3->post_literal_equal = '\x01';
    }
    if (bVar7 == 0x2b && !bVar5) {
      *_c = ' ';
      bVar7 = 0x20;
    }
    if ((bVar7 != 0x2f) || (paVar3->frag_index[0x4c] != '\0')) break;
    cVar6 = '\x01';
    goto LAB_0011d16e;
  case '\x01':
    if (bVar7 == 0x2f) {
      return 1;
    }
    if (bVar7 == 0x2e) {
      paVar3->ups = '\x02';
      return 1;
    }
LAB_0011d16c:
    cVar6 = '\0';
LAB_0011d16e:
    paVar3->ups = cVar6;
    break;
  case '\x02':
    if (bVar7 == 0x2f) {
      paVar3->ups = '\x01';
    }
    else {
      if (bVar7 != 0x2e) {
        paVar3->ups = '\0';
        iVar8 = issue_char(wsi,'.');
        if (iVar8 < 0) goto LAB_0011d051;
        break;
      }
      paVar3->ups = '\x03';
    }
    goto LAB_0011cf14;
  case '\x03':
    if ((bVar7 & 0xef) != 0x2f) {
      iVar8 = issue_char(wsi,'.');
      if (iVar8 < 0) {
        return -1;
      }
      iVar8 = issue_char(wsi,'.');
      if (iVar8 < 0) {
        return -1;
      }
      goto LAB_0011d16c;
    }
    bVar2 = paVar3->nfrag;
    uVar9 = paVar3->frags[bVar2].len;
    if (2 < uVar9) {
      aVar10 = paVar3->pos;
      paVar3->pos = aVar10 - 1;
      paVar3->frags[bVar2].len = uVar9 - 1;
      uVar9 = uVar9 - 2;
      uVar11 = aVar10 - 2;
      do {
        paVar3->pos = uVar11;
        paVar3->frags[bVar2].len = uVar9;
        if (uVar9 < 2) break;
        uVar12 = (ulong)uVar11;
        uVar9 = uVar9 - 1;
        uVar11 = uVar11 - 1;
      } while (paVar3->data[uVar12] != '/');
    }
    paVar3->ups = '\x01';
    if (paVar3->frags[bVar2].len < 2) {
      return 1;
    }
  }
  iVar8 = 0;
  if (((!bVar5 && bVar7 == 0x3f) && (paVar3->frag_index[0x4c] == '\0')) &&
     (iVar8 = 2, paVar3->ues == '\0')) {
    iVar8 = issue_char(wsi,'\0');
    if (iVar8 < 0) {
LAB_0011d051:
      iVar8 = -1;
    }
    else {
      paVar4 = (wsi->http).ah;
      puVar1 = &paVar4->frags[paVar4->nfrag].len;
      *puVar1 = *puVar1 - 1;
      bVar7 = paVar3->nfrag + 1;
      paVar3->nfrag = bVar7;
      iVar8 = 3;
      if (bVar7 < 0x60) {
        aVar10 = paVar3->pos + 1;
        paVar3->pos = aVar10;
        paVar3->frags[bVar7].offset = aVar10;
        paVar3->frags[bVar7].len = 0;
        paVar3->frags[bVar7].nfrag = '\0';
        paVar3->post_literal_equal = '\0';
        paVar3->frag_index[0x4c] = bVar7;
        paVar3->ups = '\0';
LAB_0011cf14:
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

int
lws_parse_urldecode(struct lws *wsi, uint8_t *_c)
{
	struct allocated_headers *ah = wsi->http.ah;
	unsigned int enc = 0;
	uint8_t c = *_c;

	// lwsl_notice("ah->ups %d\n", ah->ups);

	/*
	 * PRIORITY 1
	 * special URI processing... convert %xx
	 */
	switch (ah->ues) {
	case URIES_IDLE:
		if (c == '%') {
			ah->ues = URIES_SEEN_PERCENT;
			goto swallow;
		}
		break;
	case URIES_SEEN_PERCENT:
		if (char_to_hex((char)c) < 0)
			/* illegal post-% char */
			goto forbid;

		ah->esc_stash = (char)c;
		ah->ues = URIES_SEEN_PERCENT_H1;
		goto swallow;

	case URIES_SEEN_PERCENT_H1:
		if (char_to_hex((char)c) < 0)
			/* illegal post-% char */
			goto forbid;

		*_c = (uint8_t)(unsigned int)((char_to_hex(ah->esc_stash) << 4) |
				char_to_hex((char)c));
		c = *_c;
		enc = 1;
		ah->ues = URIES_IDLE;
		break;
	}

	/*
	 * PRIORITY 2
	 * special URI processing...
	 *  convert /.. or /... or /../ etc to /
	 *  convert /./ to /
	 *  convert // or /// etc to /
	 *  leave /.dir or whatever alone
	 */

	if (!c && (!ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS] ||
		   !ah->post_literal_equal)) {
		/*
		 * Since user code is typically going to parse the path using
		 * NUL-terminated apis, it's too dangerous to allow NUL
		 * injection here.
		 *
		 * It's allowed in the urlargs, because the apis to access
		 * those only allow retreival with explicit length.
		 */
		lwsl_warn("%s: saw NUL outside of uri args\n", __func__);
		return -1;
	}

	switch (ah->ups) {
	case URIPS_IDLE:

		/* genuine delimiter */
		if ((c == '&' || c == ';') && !enc) {
			if (issue_char(wsi, '\0') < 0)
				return -1;
			/* don't account for it */
			wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
			/* link to next fragment */
			ah->frags[ah->nfrag].nfrag = (uint8_t)(ah->nfrag + 1);
			ah->nfrag++;
			if (ah->nfrag >= LWS_ARRAY_SIZE(ah->frags))
				goto excessive;
			/* start next fragment after the & */
			ah->post_literal_equal = 0;
			ah->frags[ah->nfrag].offset = ++ah->pos;
			ah->frags[ah->nfrag].len = 0;
			ah->frags[ah->nfrag].nfrag = 0;
			goto swallow;
		}
		/* uriencoded = in the name part, disallow */
		if (c == '=' && enc &&
		    ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS] &&
		    !ah->post_literal_equal) {
			c = '_';
			*_c =c;
		}

		/* after the real =, we don't care how many = */
		if (c == '=' && !enc)
			ah->post_literal_equal = 1;

		/* + to space */
		if (c == '+' && !enc) {
			c = ' ';
			*_c = c;
		}
		/* issue the first / always */
		if (c == '/' && !ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS])
			ah->ups = URIPS_SEEN_SLASH;
		break;
	case URIPS_SEEN_SLASH:
		/* swallow subsequent slashes */
		if (c == '/')
			goto swallow;
		/* track and swallow the first . after / */
		if (c == '.') {
			ah->ups = URIPS_SEEN_SLASH_DOT;
			goto swallow;
		}
		ah->ups = URIPS_IDLE;
		break;
	case URIPS_SEEN_SLASH_DOT:
		/* swallow second . */
		if (c == '.') {
			ah->ups = URIPS_SEEN_SLASH_DOT_DOT;
			goto swallow;
		}
		/* change /./ to / */
		if (c == '/') {
			ah->ups = URIPS_SEEN_SLASH;
			goto swallow;
		}
		/* it was like /.dir ... regurgitate the . */
		ah->ups = URIPS_IDLE;
		if (issue_char(wsi, '.') < 0)
			return -1;
		break;

	case URIPS_SEEN_SLASH_DOT_DOT:

		/* /../ or /..[End of URI] --> backup to last / */
		if (c == '/' || c == '?') {
			/*
			 * back up one dir level if possible
			 * safe against header fragmentation because
			 * the method URI can only be in 1 fragment
			 */
			if (ah->frags[ah->nfrag].len > 2) {
				ah->pos--;
				ah->frags[ah->nfrag].len--;
				do {
					ah->pos--;
					ah->frags[ah->nfrag].len--;
				} while (ah->frags[ah->nfrag].len > 1 &&
					 ah->data[ah->pos] != '/');
			}
			ah->ups = URIPS_SEEN_SLASH;
			if (ah->frags[ah->nfrag].len > 1)
				break;
			goto swallow;
		}

		/*  /..[^/] ... regurgitate and allow */

		if (issue_char(wsi, '.') < 0)
			return -1;
		if (issue_char(wsi, '.') < 0)
			return -1;
		ah->ups = URIPS_IDLE;
		break;
	}

	if (c == '?' && !enc &&
	    !ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS]) { /* start of URI args */
		if (ah->ues != URIES_IDLE)
			goto forbid;

		/* seal off uri header */
		if (issue_char(wsi, '\0') < 0)
			return -1;

		/* don't account for it */
		wsi->http.ah->frags[wsi->http.ah->nfrag].len--;

		/* move to using WSI_TOKEN_HTTP_URI_ARGS */
		ah->nfrag++;
		if (ah->nfrag >= LWS_ARRAY_SIZE(ah->frags))
			goto excessive;
		ah->frags[ah->nfrag].offset = ++ah->pos;
		ah->frags[ah->nfrag].len = 0;
		ah->frags[ah->nfrag].nfrag = 0;

		ah->post_literal_equal = 0;
		ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS] = ah->nfrag;
		ah->ups = URIPS_IDLE;
		goto swallow;
	}

	return LPUR_CONTINUE;

swallow:
	return LPUR_SWALLOW;

forbid:
	return LPUR_FORBID;

excessive:
	return LPUR_EXCESSIVE;
}